

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int htmlParseCharData(htmlParserCtxtPtr ctxt,int partial)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  xmlChar *pxVar5;
  bool bVar6;
  xmlChar *guess;
  size_t i_1;
  int terminated;
  int c;
  int solidus;
  int i;
  int digit;
  int lc;
  size_t off;
  size_t oldAvail;
  int size;
  int cur;
  size_t j;
  int local_70;
  int cp;
  int ncrSize;
  int ncr;
  int skip;
  int replSize;
  size_t avail;
  xmlChar *repl;
  xmlChar *in;
  xmlChar *chunk;
  int local_38;
  int col;
  int line;
  int eof;
  int mode;
  int done;
  int complete;
  xmlChar utf8Char [4];
  xmlParserInputPtr input;
  int partial_local;
  htmlParserCtxtPtr ctxt_local;
  
  _complete = ctxt->input;
  mode = 0;
  eof = 0;
  col = ctxt->input->flags & 0x40;
  line = ctxt->endCheckState;
  local_38 = _complete->line;
  chunk._4_4_ = _complete->col;
LAB_0019908e:
  do {
    if (1 < ctxt->disableSAX) break;
    ncrSize = 0;
    cp = 0;
    local_70 = 0;
    j._4_4_ = 0;
    repl = _complete->cur;
    _skip = _complete->end + -(long)repl;
    avail = (long)"\x01" + 1;
    ncr = 0;
    in = repl;
LAB_001990fc:
    pxVar5 = _skip;
    if (ctxt->disableSAX < 2) {
      if (_skip < (xmlChar *)0x41) {
        if (col == 0) {
          lVar4 = (long)repl - (long)in;
          _complete->cur = repl;
          xmlParserGrow(ctxt);
          repl = _complete->cur;
          in = repl + -lVar4;
          _complete->cur = in;
          _skip = _complete->end + -(long)repl;
          if (pxVar5 == _skip) {
            col = 1;
          }
        }
        if (_skip == (xmlChar *)0x0) {
          if ((partial != 0) && (cp != 0)) {
            repl = repl + -(long)local_70;
            local_70 = 0;
          }
          eof = 1;
          goto LAB_00199a9c;
        }
      }
      if (cp == 0) goto LAB_001991f7;
      goto LAB_00199272;
    }
LAB_00199a9c:
    if (0 < local_70) {
      ncrSize = local_70;
      repl = repl + -(long)local_70;
      avail = (size_t)htmlCodePointToUtf8(j._4_4_,(xmlChar *)&done,&ncr);
    }
    if (in < repl) {
      _complete->cur = _complete->cur + ((long)repl - (long)in);
      htmlCharDataSAXCallback(ctxt,in,(int)repl - (int)in,line);
    }
    _complete->cur = _complete->cur + ncrSize;
    if (0 < ncr) {
      htmlCharDataSAXCallback(ctxt,(xmlChar *)avail,ncr,line);
    }
    if ((((ctxt->input->flags & 0x40U) == 0) &&
        (500 < (long)ctxt->input->cur - (long)ctxt->input->base)) &&
       ((long)ctxt->input->end - (long)ctxt->input->cur < 500)) {
      xmlParserShrink(ctxt);
    }
  } while (eof == 0);
  _complete->line = local_38;
  _complete->col = chunk._4_4_;
  if (mode == 0) {
    ctxt->endCheckState = line;
  }
  else {
    ctxt->endCheckState = 0;
  }
  return mode;
LAB_001991f7:
  while ((_skip != (xmlChar *)0x0 &&
         ((1 << (*repl & 0x1f) & htmlParseCharData::mask[(int)(uint)*repl >> 5]) == 0))) {
    chunk._4_4_ = chunk._4_4_ + 1;
    repl = repl + 1;
    _skip = _skip + -1;
  }
  if (((col == 0) && (_skip < (xmlChar *)0x41)) || (_skip == (xmlChar *)0x0)) goto LAB_001990fc;
LAB_00199272:
  uVar2 = (uint)*repl;
  oldAvail._0_4_ = 1;
  chunk._4_4_ = chunk._4_4_ + 1;
  if (cp != 0) {
    uVar3 = uVar2 | 0x20;
    if ((uVar2 < 0x30) || (0x39 < uVar2)) {
      if ((cp != 0x10) || ((uVar3 < 0x61 || (0x66 < uVar3)))) {
        if (uVar2 == 0x3b) {
          repl = repl + 1;
          local_70 = local_70 + 1;
        }
        goto LAB_00199a9c;
      }
      solidus = uVar3 - 0x57;
    }
    else {
      solidus = uVar2 - 0x30;
    }
    j._4_4_ = j._4_4_ * cp + solidus;
    if (0x10ffff < j._4_4_) {
      j._4_4_ = 0x110000;
    }
    local_70 = local_70 + 1;
    goto LAB_00199a75;
  }
  if (uVar2 == 0) {
    ncrSize = 1;
    avail = (size_t)anon_var_dwarf_f84e;
    ncr = 3;
    goto LAB_00199a9c;
  }
  if (uVar2 == 10) {
    local_38 = local_38 + 1;
    chunk._4_4_ = 1;
    goto LAB_00199a75;
  }
  if (uVar2 == 0xd) {
    if ((partial == 0) || ((xmlChar *)0x1 < _skip)) {
      ncrSize = 1;
      if (repl[1] != '\n') {
        avail = (long)"\r\n" + 1;
        ncr = 1;
      }
    }
    else {
      eof = 1;
    }
    goto LAB_00199a9c;
  }
  if (uVar2 == 0x26) {
    if ((line == 0) || (line == 1)) {
      _size = (xmlChar *)0x1;
      if ((_skip < (xmlChar *)0x2) || (repl[1] != '#')) {
        if (partial != 0) {
          bVar6 = false;
          for (guess = (xmlChar *)0x1; guess < _skip; guess = guess + 1) {
            if (((xmlChar *)0x1f < guess) ||
               ((((repl[(long)guess] | 0x20) < 0x61 || (0x7a < (repl[(long)guess] | 0x20))) &&
                ((guess < (xmlChar *)0x2 ||
                 ((repl[(long)guess] < 0x30 || (0x39 < repl[(long)guess])))))))) {
              bVar6 = true;
              break;
            }
          }
          if (!bVar6) {
            eof = 1;
            goto LAB_00199a9c;
          }
        }
        avail = (size_t)htmlFindEntityPrefix(repl + 1,(size_t)(_skip + -1),0,&ncrSize,&ncr);
        if ((xmlChar *)avail != (xmlChar *)0x0) {
          ncrSize = ncrSize + 1;
          goto LAB_00199a9c;
        }
        ncrSize = 0;
        pxVar5 = _size;
      }
      else {
        _size = (xmlChar *)0x2;
        pxVar5 = (xmlChar *)0x2;
        if ((xmlChar *)0x2 < _skip) {
          if ((repl[2] | 0x20) == 0x78) {
            pxVar5 = (xmlChar *)0x3;
            if (((xmlChar *)0x3 < _skip) &&
               (((0x2f < repl[3] && (repl[3] < 0x3a)) ||
                ((0x60 < (repl[3] | 0x20) && ((repl[3] | 0x20) < 0x67)))))) {
              cp = 0x10;
              oldAvail._0_4_ = 3;
              local_70 = 3;
              j._4_4_ = 0;
            }
          }
          else {
            pxVar5 = _size;
            if ((0x2f < repl[2]) && (repl[2] < 0x3a)) {
              cp = 10;
              oldAvail._0_4_ = 2;
              local_70 = 2;
              j._4_4_ = 0;
            }
          }
        }
      }
      _size = pxVar5;
      if ((partial != 0) && (_skip <= _size)) {
        eof = 1;
        goto LAB_00199a9c;
      }
    }
    goto LAB_00199a75;
  }
  if (uVar2 == 0x2d) {
    if ((line == 5) || (line == 6)) {
      _size = (xmlChar *)0x1;
      if (((xmlChar *)0x1 < _skip) &&
         (((repl[1] == '-' && (_size = (xmlChar *)0x2, (xmlChar *)0x2 < _skip)) && (repl[2] == '>'))
         )) {
        line = 4;
      }
      if ((partial != 0) && (_skip <= _size)) {
        eof = 1;
        goto LAB_00199a9c;
      }
    }
    goto LAB_00199a75;
  }
  if (uVar2 != 0x3c) {
    if (0x7f < uVar2) {
      if ((_complete->flags & 1U) == 0) {
        if (repl <= in) {
          pxVar5 = htmlFindEncoding(ctxt);
          if (pxVar5 == (xmlChar *)0x0) {
            xmlSwitchEncoding(ctxt,XML_CHAR_ENCODING_8859_1);
          }
          else {
            xmlSwitchEncodingName(ctxt,(char *)pxVar5);
            (*xmlFree)(pxVar5);
          }
          _complete->flags = _complete->flags | 1;
          col = ctxt->input->flags & 0x40;
          goto LAB_0019908e;
        }
        goto LAB_00199a9c;
      }
      oldAvail._0_4_ = htmlValidateUtf8(ctxt,repl,(size_t)_skip,partial);
      if ((partial != 0) && ((int)oldAvail == 0)) {
        eof = 1;
        goto LAB_00199a9c;
      }
      if ((int)oldAvail < 1) {
        ncrSize = 1;
        avail = (size_t)anon_var_dwarf_f84e;
        ncr = 3;
        goto LAB_00199a9c;
      }
    }
    goto LAB_00199a75;
  }
  if (line == 0) {
    eof = 1;
    mode = 1;
    goto LAB_00199a9c;
  }
  if (line == 3) goto LAB_00199a75;
  _size = (xmlChar *)0x1;
  pxVar5 = _size;
  if ((xmlChar *)0x1 < _skip) {
    if ((line == 4) && (repl[1] == '!')) {
      _size = (xmlChar *)0x2;
      pxVar5 = (xmlChar *)0x2;
      if (((((xmlChar *)0x2 < _skip) && (pxVar5 = _size, repl[2] == '-')) &&
          (pxVar5 = (xmlChar *)0x3, (xmlChar *)0x3 < _skip)) && (repl[3] == '-')) {
        line = 5;
      }
    }
    else {
      c = 0;
      if (repl[1] == '/') {
        _size = (xmlChar *)0x2;
      }
      else if (line != 5) goto LAB_001995f2;
      while( true ) {
        bVar6 = false;
        if ((_size < _skip) && (bVar6 = false, ctxt->name[c] != '\0')) {
          bVar6 = ctxt->name[c] == (repl[(long)_size] | 0x20);
        }
        if (!bVar6) break;
        c = c + 1;
        _size = _size + 1;
      }
      pxVar5 = _size;
      if (((ctxt->name[c] == '\0') && (_size < _skip)) &&
         (((bVar1 = repl[(long)_size], bVar1 == 0x3e || ((bVar1 == 0x2f || (bVar1 == 0x20)))) ||
          ((8 < bVar1 && ((bVar1 < 0xe && (bVar1 != 0xb)))))))) {
        if ((line != 5) || (repl[1] == '/')) {
          if (line != 6) {
            mode = 1;
            eof = 1;
            goto LAB_00199a9c;
          }
          line = 5;
        }
        else {
          line = 6;
        }
      }
    }
  }
LAB_001995f2:
  _size = pxVar5;
  if ((partial != 0) && (_skip <= _size)) {
    eof = 1;
    goto LAB_00199a9c;
  }
LAB_00199a75:
  repl = repl + (int)oldAvail;
  _skip = _skip + -(long)(int)oldAvail;
  goto LAB_001990fc;
}

Assistant:

static int
htmlParseCharData(htmlParserCtxtPtr ctxt, int partial) {
    xmlParserInputPtr input = ctxt->input;
    xmlChar utf8Char[4];
    int complete = 0;
    int done = 0;
    int mode;
    int eof = PARSER_PROGRESSIVE(ctxt);
    int line, col;

    mode = ctxt->endCheckState;

    line = input->line;
    col = input->col;

    while (!PARSER_STOPPED(ctxt)) {
        const xmlChar *chunk, *in, *repl;
        size_t avail;
        int replSize;
        int skip = 0;
        int ncr = 0;
        int ncrSize = 0;
        int cp = 0;

        chunk = input->cur;
        avail = input->end - chunk;
        in = chunk;

        repl = BAD_CAST "";
        replSize = 0;

        while (!PARSER_STOPPED(ctxt)) {
            size_t j;
            int cur, size;

            if (avail <= 64) {
                if (!eof) {
                    size_t oldAvail = avail;
                    size_t off = in - chunk;

                    input->cur = in;

                    xmlParserGrow(ctxt);

                    in = input->cur;
                    chunk = in - off;
                    input->cur = chunk;
                    avail = input->end - in;

                    if (oldAvail == avail)
                        eof = 1;
                }

                if (avail == 0) {
                    if ((partial) && (ncr)) {
                        in -= ncrSize;
                        ncrSize = 0;
                    }

                    done = 1;
                    break;
                }
            }

            /* Accelerator */
            if (!ncr) {
                while (avail > 0) {
                    static const unsigned mask[8] = {
                        0x00002401, 0x10002040,
                        0x00000000, 0x00000000,
                        0xFFFFFFFF, 0xFFFFFFFF,
                        0xFFFFFFFF, 0xFFFFFFFF
                    };
                    cur = *in;
                    if ((1u << (cur & 0x1F)) & mask[cur >> 5])
                        break;
                    col += 1;
                    in += 1;
                    avail -= 1;
                }

                if ((!eof) && (avail <= 64))
                    continue;
                if (avail == 0)
                    continue;
            }

            cur = *in;
            size = 1;
            col += 1;

            if (ncr) {
                int lc = cur | 0x20;
                int digit;

                if ((cur >= '0') && (cur <= '9')) {
                    digit = cur - '0';
                } else if ((ncr == 16) && (lc >= 'a') && (lc <= 'f')) {
                    digit = (lc - 'a') + 10;
                } else {
                    if (cur == ';') {
                        in += 1;
                        size += 1;
                        ncrSize += 1;
                    }
                    goto next_chunk;
                }

                cp = cp * ncr + digit;
                if (cp >= 0x110000)
                    cp = 0x110000;

                ncrSize += 1;

                goto next_char;
            }

            switch (cur) {
            case '<':
                if (mode == 0) {
                    done = 1;
                    complete = 1;
                    goto next_chunk;
                }
                if (mode == DATA_PLAINTEXT)
                    break;

                j = 1;
                if (j < avail) {
                    if ((mode == DATA_SCRIPT) && (in[j] == '!')) {
                        /* Check for comment start */

                        j += 1;
                        if ((j < avail) && (in[j] == '-')) {
                            j += 1;
                            if ((j < avail) && (in[j] == '-'))
                                mode = DATA_SCRIPT_ESC1;
                        }
                    } else {
                        int i = 0;
                        int solidus = 0;

                        /* Check for tag */

                        if (in[j] == '/') {
                            j += 1;
                            solidus = 1;
                        }

                        if ((solidus) || (mode == DATA_SCRIPT_ESC1)) {
                            while ((j < avail) &&
                                   (ctxt->name[i] != 0) &&
                                   (ctxt->name[i] == (in[j] | 0x20))) {
                                i += 1;
                                j += 1;
                            }

                            if ((ctxt->name[i] == 0) && (j < avail)) {
                                int c = in[j];

                                if ((c == '>') || (c == '/') ||
                                    (IS_WS_HTML(c))) {
                                    if ((mode == DATA_SCRIPT_ESC1) &&
                                        (!solidus)) {
                                        mode = DATA_SCRIPT_ESC2;
                                    } else if (mode == DATA_SCRIPT_ESC2) {
                                        mode = DATA_SCRIPT_ESC1;
                                    } else {
                                        complete = 1;
                                        done = 1;
                                        goto next_chunk;
                                    }
                                }
                            }
                        }
                    }
                }

                if ((partial) && (j >= avail)) {
                    done = 1;
                    goto next_chunk;
                }

                break;

            case '-':
                if ((mode != DATA_SCRIPT_ESC1) && (mode != DATA_SCRIPT_ESC2))
                    break;

                /* Check for comment end */

                j = 1;
                if ((j < avail) && (in[j] == '-')) {
                    j += 1;
                    if ((j < avail) && (in[j] == '>'))
                        mode = DATA_SCRIPT;
                }

                if ((partial) && (j >= avail)) {
                    done = 1;
                    goto next_chunk;
                }

                break;

            case '&':
                if ((mode != 0) && (mode != DATA_RCDATA))
                    break;

                j = 1;

                if ((j < avail) && (in[j] == '#')) {
                    j += 1;
                    if (j < avail) {
                        if ((in[j] | 0x20) == 'x') {
                            j += 1;
                            if ((j < avail) && (IS_HEX_DIGIT(in[j]))) {
                                ncr = 16;
                                size = 3;
                                ncrSize = 3;
                                cp = 0;
                            }
                        } else if (IS_ASCII_DIGIT(in[j])) {
                            ncr = 10;
                            size = 2;
                            ncrSize = 2;
                            cp = 0;
                        }
                    }
                } else {
                    if (partial) {
                        int terminated = 0;
                        size_t i;

                        /*
                         * &CounterClockwiseContourIntegral; has 33 bytes.
                         */
                        for (i = 1; i < avail; i++) {
                            if ((i >= 32) ||
                                (!IS_ASCII_LETTER(in[i]) &&
                                 ((i < 2) || !IS_ASCII_DIGIT(in[i])))) {
                                terminated = 1;
                                break;
                            }
                        }

                        if (!terminated) {
                            done = 1;
                            goto next_chunk;
                        }
                    }

                    repl = htmlFindEntityPrefix(in + j,
                                                avail - j,
                                                /* isAttr */ 0,
                                                &skip, &replSize);
                    if (repl != NULL) {
                        skip += 1;
                        goto next_chunk;
                    }

                    skip = 0;
                }

                if ((partial) && (j >= avail)) {
                    done = 1;
                    goto next_chunk;
                }

                break;

            case '\0':
                skip = 1;
                repl = BAD_CAST "\xEF\xBF\xBD";
                replSize = 3;
                goto next_chunk;

            case '\n':
                line += 1;
                col = 1;
                break;

            case '\r':
                if (partial && avail < 2) {
                    done = 1;
                    goto next_chunk;
                }

                skip = 1;
                if (in[1] != 0x0A) {
                    repl = BAD_CAST "\x0A";
                    replSize = 1;
                }
                goto next_chunk;

            default:
                if (cur < 0x80)
                    break;

                if ((input->flags & XML_INPUT_HAS_ENCODING) == 0) {
                    xmlChar * guess;

                    if (in > chunk)
                        goto next_chunk;

#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
                    guess = NULL;
#else
                    guess = htmlFindEncoding(ctxt);
#endif
                    if (guess == NULL) {
                        xmlSwitchEncoding(ctxt, XML_CHAR_ENCODING_8859_1);
                    } else {
                        xmlSwitchEncodingName(ctxt, (const char *) guess);
                        xmlFree(guess);
                    }
                    input->flags |= XML_INPUT_HAS_ENCODING;

                    eof = PARSER_PROGRESSIVE(ctxt);
                    goto restart;
                }

                size = htmlValidateUtf8(ctxt, in, avail, partial);

                if ((partial) && (size == 0)) {
                    done = 1;
                    goto next_chunk;
                }

                if (size <= 0) {
                    skip = 1;
                    repl = BAD_CAST "\xEF\xBF\xBD";
                    replSize = 3;
                    goto next_chunk;
                }

                break;
            }

next_char:
            in += size;
            avail -= size;
        }

next_chunk:
        if (ncrSize > 0) {
            skip = ncrSize;
            in -= ncrSize;

            repl = htmlCodePointToUtf8(cp, utf8Char, &replSize);
        }

        if (in > chunk) {
            input->cur += in - chunk;
            htmlCharDataSAXCallback(ctxt, chunk, in - chunk, mode);
        }

        input->cur += skip;
        if (replSize > 0)
            htmlCharDataSAXCallback(ctxt, repl, replSize, mode);

        SHRINK;

        if (done)
            break;

restart:
        ;
    }

    input->line = line;
    input->col = col;

    if (complete)
        ctxt->endCheckState = 0;
    else
        ctxt->endCheckState = mode;

    return(complete);
}